

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall kratos::FSMVisitor::visit(FSMVisitor *this,Generator *generator)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>_>_>
  *this_00;
  reference ppVar2;
  element_type *peVar3;
  FSM *pFVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>
  *iter;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>_>_>
  *__range2;
  Generator *generator_local;
  FSMVisitor *this_local;
  
  bVar1 = Generator::is_cloned(generator);
  if (!bVar1) {
    this_00 = Generator::fsms_abi_cxx11_(generator);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>_>_>
             ::begin(this_00);
    iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>_>_>
              ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&iter), bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>_>
               ::operator*(&__end2);
      peVar3 = std::__shared_ptr_access<kratos::FSM,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::FSM,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ppVar2->second);
      bVar1 = FSM::realized(peVar3);
      if (!bVar1) {
        peVar3 = std::__shared_ptr_access<kratos::FSM,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::FSM,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ppVar2->second);
        pFVar4 = FSM::parent_fsm(peVar3);
        if (pFVar4 == (FSM *)0x0) {
          peVar3 = std::__shared_ptr_access<kratos::FSM,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::FSM,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&ppVar2->second);
          FSM::realize(peVar3);
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSM>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator->is_cloned()) return;
        for (auto const& iter : generator->fsms()) {
            if (!iter.second->realized() && !iter.second->parent_fsm()) iter.second->realize();
        }
    }